

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

LoggerInstance * gnilk::Logger::GetInstance(string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  mapped_type *ppLVar4;
  Logger *this;
  mapped_type pLVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>
  local_40;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
          ::find(&loggers_abi_cxx11_._M_t,name);
  if ((_Rb_tree_header *)iVar3._M_node == &loggers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    this = (Logger *)operator_new(0x30);
    Logger(this,name);
    pLVar5 = (mapped_type)operator_new(0x10);
    pLVar5->_vptr_LoggerInstance = (_func_int **)&PTR__LoggerInstance_0011c968;
    pLVar5->pLogger = (ILogger *)this;
    paVar1 = &local_40.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_40.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,pcVar2 + name->_M_string_length);
    local_40.second = pLVar5;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>,std::_Select1st<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,gnilk::LoggerInstance*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>,std::_Select1st<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>>
                *)&loggers_abi_cxx11_,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.first._M_dataplus._M_p,
                      local_40.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ppLVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
              ::operator[](&loggers_abi_cxx11_,name);
    pLVar5 = *ppLVar4;
  }
  return pLVar5;
}

Assistant:

LoggerInstance *Logger::GetInstance(const std::string &name) {

    // We need a maximum
	if (loggers.find(name) == loggers.end()) {
		// Have to create logger
		ILogger *pLogger = (ILogger *)new Logger(name);
		LoggerInstance *pInstance = new LoggerInstance(pLogger);
		// TODO: Support for exclude list		
		loggers.insert(std::pair<std::string, LoggerInstance *>(name, pInstance));

		return pInstance;
	}
	return loggers[name];
}